

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.h
# Opt level: O0

void __thiscall QStyleOptionToolBox::~QStyleOptionToolBox(QStyleOptionToolBox *this)

{
  QStyleOption *in_RDI;
  
  QIcon::~QIcon((QIcon *)&in_RDI[1].rect.x2);
  QString::~QString((QString *)0x44ddfe);
  QStyleOption::~QStyleOption(in_RDI);
  return;
}

Assistant:

class Q_WIDGETS_EXPORT QStyleOptionToolBox : public QStyleOption
{
public:
    enum StyleOptionType { Type = SO_ToolBox };
    enum StyleOptionVersion { Version = 1 };

    QString text;
    QIcon icon;

    enum TabPosition { Beginning, Middle, End, OnlyOneTab };
    enum SelectedPosition { NotAdjacent, NextIsSelected, PreviousIsSelected };

    TabPosition position;
    SelectedPosition selectedPosition;

    QStyleOptionToolBox();
    QStyleOptionToolBox(const QStyleOptionToolBox &other) : QStyleOption(Version, Type) { *this = other; }
    QStyleOptionToolBox &operator=(const QStyleOptionToolBox &) = default;

protected:
    QStyleOptionToolBox(int version);
}